

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

bool __thiscall
CheaterBotStrategy::exchangeCountryOwnership
          (CheaterBotStrategy *this,Player *defendingPlayer,Country *toExchange)

{
  Country *this_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar4;
  size_type sVar5;
  reference ppCVar6;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar7;
  bool bVar8;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  local_48;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  local_40;
  const_iterator local_38;
  int local_30;
  int local_2c;
  int i;
  int toExchangeIndex;
  Country *toExchange_local;
  Player *defendingPlayer_local;
  CheaterBotStrategy *this_local;
  
  local_2c = -1;
  local_30 = 0;
  _i = toExchange;
  toExchange_local = (Country *)defendingPlayer;
  defendingPlayer_local = (Player *)this;
  do {
    uVar3 = (ulong)local_30;
    pvVar4 = Player::getOwnedCountries((Player *)toExchange_local);
    sVar5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar4);
    this_00 = _i;
    if (sVar5 <= uVar3) {
      bVar8 = local_2c != -1;
      if (bVar8) {
        iVar1 = Player::getPlayerId((this->super_PlayerStrategy).player);
        Map::Country::setPlayerOwnerID(this_00,iVar1);
        pvVar4 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
        pvVar7 = Player::getOwnedCountries((Player *)toExchange_local);
        ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pvVar7,(long)local_2c);
        std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(pvVar4,ppCVar6);
        pvVar4 = Player::getOwnedCountries((Player *)toExchange_local);
        pvVar7 = Player::getOwnedCountries((Player *)toExchange_local);
        local_48._M_current =
             (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar7)
        ;
        local_40 = __gnu_cxx::
                   __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                   ::operator+(&local_48,(long)local_2c);
        __gnu_cxx::
        __normal_iterator<Map::Country*const*,std::vector<Map::Country*,std::allocator<Map::Country*>>>
        ::__normal_iterator<Map::Country**>
                  ((__normal_iterator<Map::Country*const*,std::vector<Map::Country*,std::allocator<Map::Country*>>>
                    *)&local_38,&local_40);
        std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::erase(pvVar4,local_38);
      }
      return bVar8;
    }
    pvVar4 = Player::getOwnedCountries((Player *)toExchange_local);
    ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (pvVar4,(long)local_30);
    iVar1 = Map::Country::getCountryId(*ppCVar6);
    iVar2 = Map::Country::getCountryId(_i);
    if (iVar1 == iVar2) {
      if (local_2c != -1) {
        return false;
      }
      local_2c = local_30;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool CheaterBotStrategy::exchangeCountryOwnership(Player* defendingPlayer, Map::Country* toExchange) {
    int toExchangeIndex = -1;

    for (int i = 0; i < defendingPlayer->getOwnedCountries()->size(); i++) {
        if (defendingPlayer->getOwnedCountries()->at(i)->getCountryId() == toExchange->getCountryId()) {
            if (toExchangeIndex != -1) {
                return false;
            }
            toExchangeIndex = i;
        }
    }

    if (toExchangeIndex == -1) {
        return false;
    }

    toExchange->setPlayerOwnerID(this->player->getPlayerId());
    this->player->getOwnedCountries()->push_back(defendingPlayer->getOwnedCountries()->at(toExchangeIndex));
    defendingPlayer->getOwnedCountries()->erase(defendingPlayer->getOwnedCountries()->begin() + toExchangeIndex);
    return true;
}